

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O2

void __thiscall gvr::TexturedMesh::loadPLY(TexturedMesh *this,PLYReader *ply)

{
  string *this_00;
  bool bVar1;
  ply_type pVar2;
  ply_type pVar3;
  ply_type pVar4;
  long lVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  string local_400;
  string local_3e0;
  allocator local_3be;
  allocator local_3bd;
  allocator local_3bc;
  allocator local_3bb;
  allocator local_3ba;
  allocator local_3b9;
  allocator local_3b8;
  allocator local_3b7;
  allocator local_3b6;
  allocator local_3b5;
  allocator local_3b4;
  allocator local_3b3;
  allocator local_3b2;
  allocator local_3b1;
  FloatArrayReceiver tu;
  FloatArrayReceiver sx;
  FloatArrayReceiver ss;
  FloatArrayReceiver nx;
  FloatArrayReceiver tv;
  FloatArrayReceiver sy;
  FloatArrayReceiver se;
  FloatArrayReceiver ny;
  FloatArrayReceiver vx;
  string local_288;
  string local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  TriangleReceiver tr;
  FloatArrayReceiver vy;
  FloatArrayReceiver sc;
  FloatArrayReceiver vz;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&vy);
  lVar5 = PLYReader::instancesOfElement(ply,(string *)&vx);
  std::__cxx11::string::~string((string *)&vx);
  Model::setOriginFromPLY((Model *)this,ply);
  this_00 = &this->basepath;
  std::__cxx11::string::assign((char *)this_00);
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PLYReader::getComments(ply,&comment);
  lVar8 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)comment.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)comment.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    lVar6 = std::__cxx11::string::find
                      ((char *)((long)&((comment.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar8),0x126a84);
    if (lVar6 == 0) {
LAB_00120510:
      std::__cxx11::string::substr
                ((ulong)&vx,
                 (long)&((comment.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8);
      std::__cxx11::string::operator=((string *)&this->name,(string *)&vx);
      std::__cxx11::string::~string((string *)&vx);
      gutil::trim((string *)&this->name);
      std::__cxx11::string::assign((char *)this_00);
      lVar8 = std::__cxx11::string::find_last_of((char *)this_00,0x126a9c);
      if (lVar8 == -1) {
        std::__cxx11::string::assign((char *)this_00);
      }
      else {
        std::__cxx11::string::substr((ulong)&vx,(ulong)this_00);
        std::__cxx11::string::operator=((string *)this_00,(string *)&vx);
        std::__cxx11::string::~string((string *)&vx);
      }
      break;
    }
    lVar6 = std::__cxx11::string::find
                      ((char *)((long)&((comment.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar8),0x126a90);
    if (lVar6 == 0) goto LAB_00120510;
    lVar8 = lVar8 + 0x20;
  }
  std::__cxx11::string::string((string *)&vx,"vertex",(allocator *)&se);
  std::__cxx11::string::string((string *)&vy,"scan_size",(allocator *)&sc);
  pVar2 = PLYReader::getTypeOfProperty(ply,(string *)&vx,(string *)&vy);
  uVar7 = 1;
  if (pVar2 == ply_none) {
    std::__cxx11::string::string((string *)&local_50,"vertex",&local_3b1);
    std::__cxx11::string::string((string *)&local_70,"scan_error",&local_3b2);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_50,&local_70);
    if (pVar3 != ply_none) goto LAB_00120672;
    std::__cxx11::string::string((string *)&local_90,"vertex",&local_3b3);
    std::__cxx11::string::string((string *)&local_b0,"scan_conf",&local_3b4);
    pVar3 = PLYReader::getTypeOfProperty(ply,&local_90,&local_b0);
    uVar7 = (ulong)(pVar3 != ply_none);
    bVar9 = true;
  }
  else {
LAB_00120672:
    bVar9 = false;
  }
  std::__cxx11::string::string((string *)&vz,"vertex",(allocator *)&sx);
  std::__cxx11::string::string((string *)&ss,"sx",(allocator *)&sy);
  pVar3 = PLYReader::getTypeOfProperty(ply,(string *)&vz,(string *)&ss);
  if (pVar3 == ply_none) {
LAB_0012076e:
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_d0,"vertex",&local_3b5);
    std::__cxx11::string::string((string *)&local_f0,"sy",&local_3b6);
    pVar4 = PLYReader::getTypeOfProperty(ply,&local_d0,&local_f0);
    if (pVar4 == ply_none) goto LAB_0012076e;
    std::__cxx11::string::string((string *)&local_110,"vertex",&local_3b7);
    std::__cxx11::string::string((string *)&local_130,"sz",&local_3b8);
    PLYReader::getTypeOfProperty(ply,&local_110,&local_130);
    bVar1 = true;
  }
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,lVar5,uVar7);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  if (pVar3 != ply_none) {
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&vz);
  if (bVar9) {
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (pVar2 == ply_none) {
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&vy);
  std::__cxx11::string::~string((string *)&vx);
  FloatArrayReceiver::FloatArrayReceiver(&vx,(this->super_Mesh).super_PointCloud.vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&vy,(this->super_Mesh).super_PointCloud.vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&vz,(this->super_Mesh).super_PointCloud.vertex,3,2);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"x",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"y",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vy.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"vertex",(allocator *)&sc);
  std::__cxx11::string::string((string *)&se,"z",(allocator *)&sx);
  PLYReader::setReceiver(ply,(string *)&ss,(string *)&se,&vz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&se);
  std::__cxx11::string::~string((string *)&ss);
  FloatArrayReceiver::FloatArrayReceiver(&ss,(this->super_Mesh).super_PointCloud.scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&se,(this->super_Mesh).super_PointCloud.scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sc,(this->super_Mesh).super_PointCloud.scanprop,3,2);
  if ((this->super_Mesh).super_PointCloud.scanprop != (float *)0x0) {
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_size",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&ss.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_error",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&se.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
    std::__cxx11::string::string((string *)&sx,"vertex",(allocator *)&sz);
    std::__cxx11::string::string((string *)&sy,"scan_conf",(allocator *)&nx);
    PLYReader::setReceiver(ply,(string *)&sx,(string *)&sy,&sc.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&sy);
    std::__cxx11::string::~string((string *)&sx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&sx,(this->super_Mesh).super_PointCloud.scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&sy,(this->super_Mesh).super_PointCloud.scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&sz,(this->super_Mesh).super_PointCloud.scanpos,3,2);
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sx",(allocator *)&tu);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sx.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sy",(allocator *)&tu);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sy.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
    std::__cxx11::string::string((string *)&nx,"vertex",(allocator *)&nz);
    std::__cxx11::string::string((string *)&ny,"sz",(allocator *)&tu);
    PLYReader::setReceiver(ply,(string *)&nx,(string *)&ny,&sz.super_PLYReceiver);
    std::__cxx11::string::~string((string *)&ny);
    std::__cxx11::string::~string((string *)&nx);
  }
  FloatArrayReceiver::FloatArrayReceiver(&nx,(this->super_Mesh).normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&ny,(this->super_Mesh).normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&nz,(this->super_Mesh).normal,3,2);
  std::__cxx11::string::string((string *)&tu,"vertex",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&tv,"nx",(allocator *)&local_3e0);
  PLYReader::setReceiver(ply,(string *)&tu,(string *)&tv,&nx.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&tv);
  std::__cxx11::string::~string((string *)&tu);
  std::__cxx11::string::string((string *)&tu,"vertex",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&tv,"ny",(allocator *)&local_3e0);
  PLYReader::setReceiver(ply,(string *)&tu,(string *)&tv,&ny.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&tv);
  std::__cxx11::string::~string((string *)&tu);
  std::__cxx11::string::string((string *)&tu,"vertex",(allocator *)&local_400);
  std::__cxx11::string::string((string *)&tv,"nz",(allocator *)&local_3e0);
  PLYReader::setReceiver(ply,(string *)&tu,(string *)&tv,&nz.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&tv);
  std::__cxx11::string::~string((string *)&tu);
  FloatArrayReceiver::FloatArrayReceiver(&tu,this->uv,2,0);
  FloatArrayReceiver::FloatArrayReceiver(&tv,this->uv,2,1);
  std::__cxx11::string::string((string *)&local_400,"vertex",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&local_3e0,"u",(allocator *)&local_288);
  PLYReader::setReceiver(ply,&local_400,&local_3e0,&tu.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string((string *)&local_400,"vertex",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&local_3e0,"v",(allocator *)&local_288);
  PLYReader::setReceiver(ply,&local_400,&local_3e0,&tv.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string((string *)&local_400,"vertex",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&local_3e0,"texture_u",(allocator *)&local_288);
  PLYReader::setReceiver(ply,&local_400,&local_3e0,&tu.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string((string *)&local_400,"vertex",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&local_3e0,"texture_v",(allocator *)&local_288);
  PLYReader::setReceiver(ply,&local_400,&local_3e0,&tv.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string((string *)&local_400,"vertex",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&local_3e0,"s",(allocator *)&local_288);
  PLYReader::setReceiver(ply,&local_400,&local_3e0,&tu.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string((string *)&local_400,"vertex",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&local_3e0,"t",(allocator *)&local_288);
  PLYReader::setReceiver(ply,&local_400,&local_3e0,&tv.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string((string *)&local_400,"face",(allocator *)&local_3e0);
  uVar7 = PLYReader::instancesOfElement(ply,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(this,uVar7 & 0xffffffff);
  tr.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&PTR_setValue_001319b0;
  tr.p = &this->super_Mesh;
  std::__cxx11::string::string((string *)&local_400,"face",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&local_3e0,"vertex_index",(allocator *)&local_288);
  PLYReader::setReceiver(ply,&local_400,&local_3e0,&tr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::string((string *)&local_400,"face",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&local_3e0,"vertex_indices",(allocator *)&local_288);
  PLYReader::setReceiver(ply,&local_400,&local_3e0,&tr.super_PLYReceiver);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  PLYReader::readData(ply);
  std::__cxx11::string::string((string *)&local_400,"vertex",&local_3b9);
  std::__cxx11::string::string((string *)&local_3e0,"nx",&local_3ba);
  pVar2 = PLYReader::getTypeOfProperty(ply,&local_400,&local_3e0);
  if (pVar2 == ply_none) {
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
  }
  else {
    std::__cxx11::string::string((string *)&local_268,"vertex",&local_3bb);
    std::__cxx11::string::string((string *)&local_288,"ny",&local_3bc);
    pVar2 = PLYReader::getTypeOfProperty(ply,&local_268,&local_288);
    if (pVar2 == ply_none) {
      bVar9 = true;
    }
    else {
      std::__cxx11::string::string((string *)&local_150,"vertex",&local_3bd);
      std::__cxx11::string::string((string *)&local_170,"nz",&local_3be);
      pVar2 = PLYReader::getTypeOfProperty(ply,&local_150,&local_170);
      bVar9 = pVar2 == ply_none;
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    if (!bVar9) {
      Mesh::normalizeNormals(&this->super_Mesh);
      goto LAB_00121372;
    }
  }
  Mesh::recalculateNormals(&this->super_Mesh);
LAB_00121372:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment);
  return;
}

Assistant:

void TexturedMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // get texture name

  basepath="";

  std::vector<std::string> comment;
  ply.getComments(comment);

  for (size_t i=0; i<comment.size(); i++)
  {
    size_t k=comment[i].find("TextureFile");

    if (k != 0)
    {
      k=comment[i].find("texturefile");
    }

    if (k == 0)
    {
      name=comment[i].substr(11);
      gutil::trim(name);

      basepath=ply.getName();

      size_t j=basepath.find_last_of("/\\");

      if (j != basepath.npos)
      {
        basepath=basepath.substr(0, j+1);
      }
      else
      {
        basepath="";
      }

      break;
    }
  }

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  FloatArrayReceiver tu(getTextureCoordArray(), 2, 0), tv(getTextureCoordArray(), 2, 1);

  ply.setReceiver("vertex", "u", &tu);
  ply.setReceiver("vertex", "v", &tv);
  ply.setReceiver("vertex", "texture_u", &tu);
  ply.setReceiver("vertex", "texture_v", &tv);
  ply.setReceiver("vertex", "s", &tu);
  ply.setReceiver("vertex", "t", &tv);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}